

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O1

void testAttrHandler(string *tempdir)

{
  int iVar1;
  exr_result_t eVar2;
  char *pcVar3;
  ostream *poVar4;
  size_t sVar5;
  code *pcVar6;
  char *pcVar7;
  void **ppvVar8;
  exr_context_t f;
  int32_t nsz;
  exr_attribute_t *bar;
  exr_attribute_t *foo;
  uint8_t data4 [4];
  void *packed;
  exr_context_t local_50;
  int32_t local_44;
  long local_40;
  long local_38;
  undefined4 local_2c;
  void *local_28;
  
  pcVar6 = test_pack;
  iVar1 = exr_register_attr_type_handler(0,"mytype",test_unpack,test_pack,test_hdlr_destroy);
  if (iVar1 != 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_register_attr_type_handler ( __null, \"mytype\", &test_unpack, &test_pack, &test_hdlr_destroy)"
                   ,(char *)0x3cf,0x17ea72,(char *)pcVar6);
  }
  local_44 = -1;
  local_2c = 0xefbeadde;
  local_50 = createDummyFile("<attr_handler>");
  local_38 = 0;
  local_40 = 0;
  pcVar7 = "mytype";
  iVar1 = exr_attr_declare_by_type(local_50,0,"foo");
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_declare_by_type (f, 0, \"foo\", \"mytype\", &foo)",(char *)0x3d7,
                   0x17ea72,pcVar7);
  }
  if (local_38 == 0) {
    core_test_fail("foo != __null",(char *)0x3d8,0x17ea72,pcVar7);
  }
  if (*(long *)(*(long *)(local_38 + 0x18) + 0x20) != 0) {
    core_test_fail("foo->opaque->unpack_func_ptr == __null",(char *)0x3d9,0x17ea72,pcVar7);
  }
  ppvVar8 = &local_28;
  eVar2 = exr_attr_opaquedata_pack
                    (local_50,*(exr_attr_opaquedata_t **)(local_38 + 0x18),&local_44,ppvVar8);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed)",(char *)0x3dd,0x17ea72
                   ,(char *)ppvVar8);
  }
  ppvVar8 = &local_28;
  eVar2 = exr_attr_opaquedata_unpack
                    (local_50,*(exr_attr_opaquedata_t **)(local_38 + 0x18),&local_44,ppvVar8);
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_unpack (f, foo->opaque, &nsz, &packed)",(char *)0x3e0,
                   0x17ea72,(char *)ppvVar8);
  }
  if (local_50 == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    local_44 = 0;
    local_28 = (void *)0x0;
    iVar1 = (**(code **)(local_50 + 0x40))
                      (local_50,3,"Invalid reference to opaque data object to initialize");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_unpack (f, __null, &nsz, &packed)",(char *)0x3e6,0x17ea72,
                   (char *)ppvVar8);
  }
  pcVar6 = test_pack;
  iVar1 = exr_register_attr_type_handler(local_50,0,test_unpack,test_pack,test_hdlr_destroy);
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_register_attr_type_handler ( f, __null, &test_unpack, &test_pack, &test_hdlr_destroy)"
                   ,(char *)0x3eb,0x17ea72,(char *)pcVar6);
  }
  pcVar6 = test_pack;
  iVar1 = exr_register_attr_type_handler(local_50,"",test_unpack,test_pack,test_hdlr_destroy);
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_register_attr_type_handler ( f, \"\", &test_unpack, &test_pack, &test_hdlr_destroy)"
                   ,(char *)0x3ef,0x17ea72,(char *)pcVar6);
  }
  pcVar6 = test_pack;
  iVar1 = exr_register_attr_type_handler
                    (local_50,"reallongreallongreallonglongname",test_unpack,test_pack,
                     test_hdlr_destroy);
  if (iVar1 != 0xc) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(0xc);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_register_attr_type_handler ( f, \"reallongreallongreallonglongname\", &test_unpack, &test_pack, &test_hdlr_destroy)"
                   ,(char *)0x3f7,0x17ea72,(char *)pcVar6);
  }
  pcVar6 = test_pack;
  iVar1 = exr_register_attr_type_handler(local_50,"box2i",test_unpack,test_pack,test_hdlr_destroy);
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_register_attr_type_handler ( f, \"box2i\", &test_unpack, &test_pack, &test_hdlr_destroy)"
                   ,(char *)0x3fc,0x17ea72,(char *)pcVar6);
  }
  pcVar6 = test_pack;
  iVar1 = exr_register_attr_type_handler(local_50,"mytype",test_unpack,test_pack,test_hdlr_destroy);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_register_attr_type_handler ( f, \"mytype\", &test_unpack, &test_pack, &test_hdlr_destroy)"
                   ,(char *)0x3fe,0x17ea72,(char *)pcVar6);
  }
  pcVar6 = test_pack;
  iVar1 = exr_register_attr_type_handler(local_50,"mytype",test_unpack,test_pack,test_hdlr_destroy);
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_register_attr_type_handler ( f, \"mytype\", &test_unpack, &test_pack, &test_hdlr_destroy)"
                   ,(char *)0x402,0x17ea72,(char *)pcVar6);
  }
  if (*(code **)(*(long *)(local_38 + 0x18) + 0x20) != test_unpack) {
    core_test_fail("foo->opaque->unpack_func_ptr == &test_unpack",(char *)0x403,0x17ea72,
                   (char *)pcVar6);
  }
  if (*(code **)(*(long *)(local_38 + 0x18) + 0x28) != test_pack) {
    core_test_fail("foo->opaque->pack_func_ptr == &test_pack",(char *)0x404,0x17ea72,(char *)pcVar6)
    ;
  }
  if (*(code **)(*(long *)(local_38 + 0x18) + 0x30) != test_hdlr_destroy) {
    core_test_fail("foo->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy",(char *)0x405,
                   0x17ea72,(char *)pcVar6);
  }
  pcVar7 = "mytype";
  iVar1 = exr_attr_declare_by_type(local_50,0,"bar","mytype",&local_40);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_declare_by_type (f, 0, \"bar\", \"mytype\", &bar)",(char *)0x407,
                   0x17ea72,pcVar7);
  }
  if (local_40 == 0) {
    core_test_fail("bar != __null",(char *)0x408,0x17ea72,pcVar7);
  }
  if (*(code **)(*(long *)(local_40 + 0x18) + 0x20) != test_unpack) {
    core_test_fail("bar->opaque->unpack_func_ptr == &test_unpack",(char *)0x409,0x17ea72,pcVar7);
  }
  if (*(code **)(*(long *)(local_40 + 0x18) + 0x28) != test_pack) {
    core_test_fail("bar->opaque->pack_func_ptr == &test_pack",(char *)0x40a,0x17ea72,pcVar7);
  }
  if (*(code **)(*(long *)(local_40 + 0x18) + 0x30) != test_hdlr_destroy) {
    core_test_fail("bar->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy",(char *)0x40b,
                   0x17ea72,pcVar7);
  }
  pcVar7 = (char *)0x4;
  eVar2 = exr_attr_opaquedata_set_unpacked
                    (local_50,*(exr_attr_opaquedata_t **)(local_38 + 0x18),&local_2c,4);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_set_unpacked (f, foo->opaque, data4, 4)",(char *)0x40e,
                   0x17ea72,pcVar7);
  }
  s_unpack_fail = 1;
  ppvVar8 = &local_28;
  eVar2 = exr_attr_opaquedata_unpack
                    (local_50,*(exr_attr_opaquedata_t **)(local_38 + 0x18),&local_44,ppvVar8);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_unpack (f, foo->opaque, &nsz, &packed)",(char *)0x412,
                   0x17ea72,(char *)ppvVar8);
  }
  s_unpack_fail = 0;
  if (local_50 == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    local_44 = 0;
    local_28 = (void *)0x0;
    iVar1 = (**(code **)(local_50 + 0x40))
                      (local_50,3,"Invalid reference to opaque data object to initialize");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_pack (f, __null, &nsz, &packed)",(char *)0x419,0x17ea72,
                   (char *)ppvVar8);
  }
  if (local_44 != 0) {
    core_test_fail("nsz == 0",(char *)0x41a,0x17ea72,(char *)ppvVar8);
  }
  if (local_28 != (void *)0x0) {
    core_test_fail("packed == __null",(char *)0x41b,0x17ea72,(char *)ppvVar8);
  }
  ppvVar8 = &local_28;
  eVar2 = exr_attr_opaquedata_pack
                    (local_50,*(exr_attr_opaquedata_t **)(local_38 + 0x18),&local_44,ppvVar8);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed)",(char *)0x41e,0x17ea72
                   ,(char *)ppvVar8);
  }
  s_pack_fail = 1;
  ppvVar8 = &local_28;
  eVar2 = exr_attr_opaquedata_pack
                    (local_50,*(exr_attr_opaquedata_t **)(local_38 + 0x18),&local_44,ppvVar8);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed)",(char *)0x422,0x17ea72
                   ,(char *)ppvVar8);
  }
  s_pack_fail = 0;
  if (local_50 == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = (**(code **)(local_50 + 0x38))(local_50,3);
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_set_packed (f, __null, data4, 4)",(char *)0x42a,0x17ea72,
                   (char *)ppvVar8);
  }
  pcVar7 = (char *)0x4;
  eVar2 = exr_attr_opaquedata_set_packed
                    (local_50,*(exr_attr_opaquedata_t **)(local_40 + 0x18),&local_2c,4);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4)",(char *)0x42c,
                   0x17ea72,pcVar7);
  }
  pcVar7 = (char *)0x4;
  eVar2 = exr_attr_opaquedata_set_packed
                    (local_50,*(exr_attr_opaquedata_t **)(local_40 + 0x18),&local_2c,4);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4)",(char *)0x42e,
                   0x17ea72,pcVar7);
  }
  if (local_50 == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else if (*(long *)(local_40 + 0x18) == 0) {
    iVar1 = (**(code **)(local_50 + 0x38))(local_50,3);
  }
  else {
    pcVar7 = (char *)0xffffffff;
    iVar1 = (**(code **)(local_50 + 0x48))
                      (local_50,3,"Opaque data given invalid negative size (%d)");
  }
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(3);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_set_packed (f, bar->opaque, data4, -1)",(char *)0x431,
                   0x17ea72,pcVar7);
  }
  if (*(code **)(*(long *)(local_40 + 0x18) + 0x20) != test_unpack) {
    core_test_fail("bar->opaque->unpack_func_ptr == &test_unpack",(char *)0x432,0x17ea72,pcVar7);
  }
  if (*(code **)(*(long *)(local_40 + 0x18) + 0x28) != test_pack) {
    core_test_fail("bar->opaque->pack_func_ptr == &test_pack",(char *)0x433,0x17ea72,pcVar7);
  }
  if (*(code **)(*(long *)(local_40 + 0x18) + 0x30) != test_hdlr_destroy) {
    core_test_fail("bar->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy",(char *)0x434,
                   0x17ea72,pcVar7);
  }
  if (*(long *)(*(long *)(local_40 + 0x18) + 0x18) != 0) {
    core_test_fail("bar->opaque->unpacked_data == __null",(char *)0x435,0x17ea72,pcVar7);
  }
  s_unpack_fail = 1;
  ppvVar8 = &local_28;
  eVar2 = exr_attr_opaquedata_unpack
                    (local_50,*(exr_attr_opaquedata_t **)(local_40 + 0x18),&local_44,ppvVar8);
  if (eVar2 != 0x17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(0x17);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_unpack (f, bar->opaque, &nsz, &packed)",(char *)0x43a,
                   0x17ea72,(char *)ppvVar8);
  }
  s_unpack_fail = 0;
  ppvVar8 = &local_28;
  eVar2 = exr_attr_opaquedata_unpack
                    (local_50,*(exr_attr_opaquedata_t **)(local_40 + 0x18),&local_44,ppvVar8);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_unpack (f, bar->opaque, &nsz, &packed)",(char *)0x43d,
                   0x17ea72,(char *)ppvVar8);
  }
  if (*(long *)(*(long *)(local_40 + 0x18) + 0x18) == 0) {
    core_test_fail("bar->opaque->unpacked_data != __null",(char *)0x43e,0x17ea72,(char *)ppvVar8);
  }
  s_malloc_fail_on = 1;
  pcVar7 = (char *)0x4;
  eVar2 = exr_attr_opaquedata_set_packed
                    (local_50,*(exr_attr_opaquedata_t **)(local_40 + 0x18),&local_2c,4);
  s_malloc_fail_on = 0;
  if (eVar2 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4)",(char *)0x442,
                   0x17ea72,pcVar7);
  }
  if (*(long *)(*(long *)(local_40 + 0x18) + 0x18) == 0) {
    core_test_fail("bar->opaque->unpacked_data != __null",(char *)0x444,0x17ea72,pcVar7);
  }
  pcVar7 = (char *)0x4;
  eVar2 = exr_attr_opaquedata_set_packed
                    (local_50,*(exr_attr_opaquedata_t **)(local_40 + 0x18),&local_2c,4);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4)",(char *)0x447,
                   0x17ea72,pcVar7);
  }
  pcVar7 = (char *)0x4;
  eVar2 = exr_attr_opaquedata_set_unpacked
                    (local_50,*(exr_attr_opaquedata_t **)(local_38 + 0x18),&local_2c,4);
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_set_unpacked (f, foo->opaque, data4, 4)",(char *)0x44a,
                   0x17ea72,pcVar7);
  }
  s_pack_fail = 1;
  ppvVar8 = &local_28;
  eVar2 = exr_attr_opaquedata_pack
                    (local_50,*(exr_attr_opaquedata_t **)(local_38 + 0x18),&local_44,ppvVar8);
  if (eVar2 != 0x17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(0x17);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed)",(char *)0x44e,0x17ea72
                   ,(char *)ppvVar8);
  }
  s_pack_fail = 2;
  ppvVar8 = &local_28;
  eVar2 = exr_attr_opaquedata_pack
                    (local_50,*(exr_attr_opaquedata_t **)(local_38 + 0x18),&local_44,ppvVar8);
  if (eVar2 != 0x17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(0x17);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed)",(char *)0x452,0x17ea72
                   ,(char *)ppvVar8);
  }
  s_pack_fail = 0;
  s_malloc_fail_on = 1;
  ppvVar8 = &local_28;
  eVar2 = exr_attr_opaquedata_pack
                    (local_50,*(exr_attr_opaquedata_t **)(local_38 + 0x18),&local_44,ppvVar8);
  s_malloc_fail_on = 0;
  if (eVar2 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n    expected: (",0x10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    core_test_fail("exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed)",(char *)0x456,0x17ea72
                   ,(char *)ppvVar8);
  }
  exr_finish(&local_50);
  return;
}

Assistant:

void
testAttrHandler (const std::string& tempdir)
{
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_register_attr_type_handler (
            NULL, "mytype", &test_unpack, &test_pack, &test_hdlr_destroy));

    int32_t nsz = -1;
    void*   packed;
    uint8_t data4[] = {0xDE, 0xAD, 0xBE, 0xEF};

    exr_context_t    f   = createDummyFile ("<attr_handler>");
    exr_attribute_t *foo = NULL, *bar = NULL;
    EXRCORE_TEST_RVAL (exr_attr_declare_by_type (f, 0, "foo", "mytype", &foo));
    EXRCORE_TEST (foo != NULL);
    EXRCORE_TEST (foo->opaque->unpack_func_ptr == NULL);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_unpack (f, foo->opaque, &nsz, &packed));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_opaquedata_unpack (NULL, foo->opaque, &nsz, &packed));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_unpack (f, NULL, &nsz, &packed));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_register_attr_type_handler (
            f, NULL, &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_register_attr_type_handler (
            f, "", &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG,
        exr_register_attr_type_handler (
            f,
            "reallongreallongreallonglongname",
            &test_unpack,
            &test_pack,
            &test_hdlr_destroy));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_register_attr_type_handler (
            f, "box2i", &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST_RVAL (exr_register_attr_type_handler (
        f, "mytype", &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_register_attr_type_handler (
            f, "mytype", &test_unpack, &test_pack, &test_hdlr_destroy));
    EXRCORE_TEST (foo->opaque->unpack_func_ptr == &test_unpack);
    EXRCORE_TEST (foo->opaque->pack_func_ptr == &test_pack);
    EXRCORE_TEST (foo->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy);

    EXRCORE_TEST_RVAL (exr_attr_declare_by_type (f, 0, "bar", "mytype", &bar));
    EXRCORE_TEST (bar != NULL);
    EXRCORE_TEST (bar->opaque->unpack_func_ptr == &test_unpack);
    EXRCORE_TEST (bar->opaque->pack_func_ptr == &test_pack);
    EXRCORE_TEST (bar->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy);

    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_unpacked (f, foo->opaque, data4, 4));
    // make sure it keeps the unpacked value
    s_unpack_fail = 1;
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_unpack (f, foo->opaque, &nsz, &packed));
    s_unpack_fail = 0;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_opaquedata_pack (NULL, foo->opaque, &nsz, &packed));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_pack (f, NULL, &nsz, &packed));
    EXRCORE_TEST (nsz == 0);
    EXRCORE_TEST (packed == NULL);

    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    // make sure it keeps the old value
    s_pack_fail = 1;
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    s_pack_fail = 0;

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_opaquedata_set_packed (NULL, bar->opaque, data4, 4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_set_packed (f, NULL, data4, 4));
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4));
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, -1));
    EXRCORE_TEST (bar->opaque->unpack_func_ptr == &test_unpack);
    EXRCORE_TEST (bar->opaque->pack_func_ptr == &test_pack);
    EXRCORE_TEST (bar->opaque->destroy_unpacked_func_ptr == &test_hdlr_destroy);
    EXRCORE_TEST (bar->opaque->unpacked_data == NULL);

    s_unpack_fail = 1;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_CORRUPT_CHUNK,
        exr_attr_opaquedata_unpack (f, bar->opaque, &nsz, &packed));
    s_unpack_fail = 0;
    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_unpack (f, bar->opaque, &nsz, &packed));
    EXRCORE_TEST (bar->opaque->unpacked_data != NULL);

    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4));
    // make sure state didn't change
    EXRCORE_TEST (bar->opaque->unpacked_data != NULL);

    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_packed (f, bar->opaque, data4, 4));

    EXRCORE_TEST_RVAL (
        exr_attr_opaquedata_set_unpacked (f, foo->opaque, data4, 4));
    s_pack_fail = 1;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_CORRUPT_CHUNK,
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    s_pack_fail = 2;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_CORRUPT_CHUNK,
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));
    s_pack_fail = 0;
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_opaquedata_pack (f, foo->opaque, &nsz, &packed));

    exr_finish (&f);
}